

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

string * __thiscall
testing::internal::StreamableToString<char*>
          (string *__return_storage_ptr__,internal *this,char **streamable)

{
  Message *this_00;
  Message local_20;
  internal *local_18;
  char **streamable_local;
  
  local_18 = this;
  streamable_local = (char **)__return_storage_ptr__;
  Message::Message(&local_20);
  this_00 = Message::operator<<(&local_20,(char **)local_18);
  Message::GetString_abi_cxx11_(__return_storage_ptr__,this_00);
  Message::~Message(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string StreamableToString(const T& streamable) {
            return (Message() << streamable).GetString();
        }